

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)112,(moira::Mode)7,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)2> src;
  Align align;
  undefined2 in_stack_ffffffffffffffcc;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)7,(moira::Size)2>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,in_RDI);
  this_00 = StrWriter::operator<<(in_RSI);
  align.raw = in_RDI[5];
  StrWriter::operator<<(this_00,align);
  StrWriter::operator<<
            ((StrWriter *)in_stack_ffffffffffffffd0,
             (Ea<(moira::Mode)7,_(moira::Size)2> *)
             CONCAT26(in_stack_ffffffffffffffce,CONCAT24(in_stack_ffffffffffffffcc,align.raw)));
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src;
}